

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
embree::CommandLineStream::CommandLineStream
          (CommandLineStream *this,int argc,char **argv,string *name)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  long lVar3;
  ulong uVar4;
  allocator local_69;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Stream<int>).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_001d5bc0;
  local_58 = &(this->super_Stream<int>).buffer;
  (this->super_Stream<int>).start = 0;
  (this->super_Stream<int>).past = 0;
  (this->super_Stream<int>).future = 0;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::vector(local_58,0x400,(allocator_type *)&local_50);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__CommandLineStream_001d5b50;
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->args;
  this->i = 0;
  this->j = 0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__p,pcVar1,pcVar1 + name->_M_string_length);
  (this->name).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  local_60 = &(this->name).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (local_60,__p);
  if (0 < argc) {
    lVar3 = this->charNumber;
    if (**argv != '\0') {
      uVar4 = 0;
      do {
        lVar3 = lVar3 + 1;
        this->charNumber = lVar3;
        if (0x3fe < uVar4) break;
        lVar2 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((*argv)[lVar2] != '\0');
    }
    this->charNumber = lVar3 + 1;
    if (argc != 1) {
      uVar4 = 1;
      do {
        std::__cxx11::string::string((string *)&local_50,argv[uVar4],&local_69);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_68,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar4 = uVar4 + 1;
      } while ((uint)argc != uVar4);
    }
  }
  return;
}

Assistant:

CommandLineStream (int argc, char** argv, const std::string& name = "command line")
      : i(0), j(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name)))
    {
      if (argc > 0) {
	for (size_t i=0; argv[0][i] && i<1024; i++) charNumber++;
	charNumber++;
      }
      for (ssize_t k=1; k<argc; k++) args.push_back(argv[k]);
    }